

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedMS<tcu::Vector<unsigned_int,_4>,_5>::Run
          (AdvancedMS<tcu::Vector<unsigned_int,_4>,_5> *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLint level;
  GLuint texture;
  int in_ESI;
  GLuint unit;
  GLboolean layered;
  GLint layer;
  int i;
  long lVar2;
  GLenum *pGVar3;
  GLenum GVar4;
  ImageSizeMachine machine;
  ivec4 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  
  bVar1 = ShaderImageSizeBase::SupportedSamples(&this->super_ShaderImageSizeBase,in_ESI);
  lVar2 = 0x10;
  if (bVar1) {
    this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    pGVar3 = &DAT_01a9f9d0;
    lVar2 = 0;
    do {
      GVar4 = *pGVar3;
      glu::CallLogWrapper::glBindTexture(this_00,GVar4,this->m_texture[lVar2]);
      if ((uint)lVar2 < 2) {
        glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2801,0x2600);
        glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2800,0x2600);
        if (lVar2 == 0) {
          glu::CallLogWrapper::glTexImage1D(this_00,GVar4,0,0x8d70,7,0,0x8d99,0x1405,(void *)0x0);
          glu::CallLogWrapper::glTexImage1D(this_00,GVar4,1,0x8d70,3,0,0x8d99,0x1405,(void *)0x0);
          glu::CallLogWrapper::glTexImage1D(this_00,GVar4,2,0x8d70,1,0,0x8d99,0x1405,(void *)0x0);
          texture = this->m_texture[0];
          unit = 1;
          level = 1;
          layered = '\0';
        }
        else {
          glu::CallLogWrapper::glTexImage2D
                    (this_00,GVar4,0,0x8d70,7,0xf,0,0x8d99,0x1405,(void *)0x0);
          texture = this->m_texture[lVar2];
          unit = 2;
LAB_00a23a17:
          level = 0;
          layered = '\x01';
        }
        layer = 0;
        GVar4 = 35000;
      }
      else {
        if ((uint)lVar2 != 2) {
          glu::CallLogWrapper::glTexImage3DMultisample(this_00,GVar4,4,0x8d70,0x40,0x20,5,'\0');
          texture = this->m_texture[lVar2];
          unit = 4;
          goto LAB_00a23a17;
        }
        glu::CallLogWrapper::glTexImage3DMultisample(this_00,GVar4,4,0x8d70,7,9,3,'\0');
        texture = this->m_texture[lVar2];
        unit = 3;
        level = 0;
        layered = '\0';
        layer = 1;
        GVar4 = 0x88ba;
      }
      glu::CallLogWrapper::glBindImageTexture(this_00,unit,texture,level,layered,layer,GVar4,0x8d70)
      ;
      lVar2 = lVar2 + 1;
      pGVar3 = pGVar3 + 1;
    } while (lVar2 != 4);
    ImageSizeMachine::ImageSizeMachine(&machine);
    local_a8.m_data[0] = 3;
    local_a8.m_data[1] = 0;
    local_a8.m_data[2] = 0;
    local_a8.m_data[3] = 0;
    local_98 = 0xf00000007;
    uStack_90 = 0;
    local_88 = 0x900000007;
    uStack_80 = 0;
    local_78 = 0x2000000040;
    local_70 = 5;
    local_6c = 0;
    uStack_64 = 0;
    local_5c = 0;
    uStack_54 = 0;
    local_4c = 0;
    uStack_44 = 0;
    local_3c = 0;
    lVar2 = gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<unsigned_int,4>>
                      ((ImageSizeMachine *)&machine,5,true,&local_a8,true);
    ImageSizeMachine::~ImageSizeMachine(&machine);
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 5))
			return NOT_SUPPORTED;
		if (!SupportedSamples(4))
			return NOT_SUPPORTED;

		const GLenum target[4] = { GL_TEXTURE_1D, GL_TEXTURE_1D_ARRAY, GL_TEXTURE_2D_MULTISAMPLE_ARRAY,
								   GL_TEXTURE_2D_MULTISAMPLE_ARRAY };
		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] == GL_TEXTURE_1D || target[i] == GL_TEXTURE_1D_ARRAY)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexImage1D(target[i], 0, TexInternalFormat<T>(), 7, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage1D(target[i], 1, TexInternalFormat<T>(), 3, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage1D(target[i], 2, TexInternalFormat<T>(), 1, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(1, m_texture[i], 1, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexImage2D(target[i], 0, TexInternalFormat<T>(), 7, 15, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexImage3DMultisample(target[i], 4, TexInternalFormat<T>(), 7, 9, 3, GL_FALSE);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 1, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexImage3DMultisample(target[i], 4, TexInternalFormat<T>(), 64, 32, 5, GL_FALSE);
				glBindImageTexture(4, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[7] = { ivec4(3, 0, 0, 0), ivec4(7, 15, 0, 0), ivec4(7, 9, 0, 0), ivec4(64, 32, 5, 0),
						 ivec4(0),			ivec4(0),			ivec4(0) };
		return machine.Run<T>(STAGE, true, res, true);
	}